

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void pushpop_inuse_regs(dill_stream c,int pop,virtual_insn *ip)

{
  arg_info_list paVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < c->p->c_param_count; lVar2 = lVar2 + 1) {
    paVar1 = c->p->c_param_args;
    if ((&paVar1->is_register)[lVar3] != '\0') {
      (*c->j->save_restore)
                (c,pop,(int)(&paVar1->type)[lVar3],*(int *)((long)&paVar1->in_reg + lVar3));
    }
    lVar3 = lVar3 + 0x14;
  }
  return;
}

Assistant:

static void
pushpop_inuse_regs(dill_stream c, int pop, virtual_insn* ip)
{
    int i = 0;
    /* no actual reg assigns, so only the params are in use */
    for (i = 0; i < c->p->c_param_count; i++) {
        if (c->p->c_param_args[i].is_register) {
            c->j->save_restore(c, pop, c->p->c_param_args[i].type,
                               c->p->c_param_args[i].in_reg);
        }
    }
}